

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::adjustAppearanceStream
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *stream,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          *dr_map)

{
  _Rb_tree_header *p_Var1;
  QPDFObjectHandle *oh;
  size_t sVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  reference pTVar6;
  element_type *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *rnames;
  QPDFObjectHandle resources;
  QPDFObjectHandle merge_with;
  QPDFDictItems local_1d8;
  QPDFObjectHandle dict;
  QPDFObjectHandle existing_old;
  QPDFObjectHandle local_188;
  QPDFObjectHandle existing_new;
  ResourceFinder rf;
  __shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  QPDFObjectHandle::getDict(&dict);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rf,"/Resources",(allocator<char> *)&existing_new);
  QPDFObjectHandle::getKey(&resources,(string *)&dict);
  std::__cxx11::string::~string((string *)&rf);
  bVar3 = QPDFObjectHandle::isIndirect(&resources);
  QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)&rf);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&resources,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&rf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rf.last_name);
  if (bVar3) {
    oh = (QPDFObjectHandle *)(this->super_QPDFDocumentHelper).qpdf;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&resources);
    QPDF::makeIndirectObject((QPDF *)&rf,oh);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&resources,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&rf);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rf.last_name);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rf,"/Resources",(allocator<char> *)&existing_new);
  QPDFObjectHandle::replaceKey(&dict,(string *)&rf,&resources);
  std::__cxx11::string::~string((string *)&rf);
  QPDFObjectHandle::newDictionary();
  p_Var1 = &(dr_map->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var4 = (dr_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    QPDFObjectHandle::newDictionary();
    QPDFObjectHandle::replaceKey(&merge_with,(string *)(p_Var4 + 1),(QPDFObjectHandle *)&rf);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rf.last_name);
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&merge_with);
  QPDFObjectHandle::mergeResources
            (&resources,(QPDFObjectHandle *)&local_80,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  for (p_Var4 = (dr_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&rf,(string *)&resources);
    bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&rf);
    if (bVar3) {
      for (p_Var5 = p_Var4[2]._M_right; p_Var5 != (_Base_ptr)&p_Var4[2]._M_parent;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        QPDFObjectHandle::getKey(&existing_new,(string *)&rf);
        bVar3 = QPDFObjectHandle::isNull(&existing_new);
        if (!bVar3) {
          QPDFObjectHandle::getKey(&existing_old,(string *)&merge_with);
          QPDFObjectHandle::replaceKey(&existing_old,(string *)(p_Var5 + 2),&existing_new);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&existing_old.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        QPDFObjectHandle::getKey(&existing_old,(string *)&rf);
        bVar3 = QPDFObjectHandle::isNull(&existing_old);
        if (!bVar3) {
          QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&rf,(string *)(p_Var5 + 2),&existing_old)
          ;
          QPDFObjectHandle::removeKey((QPDFObjectHandle *)&rf,(string *)(p_Var5 + 1));
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&existing_old.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&existing_new.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rf.last_name);
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&merge_with);
  QPDFObjectHandle::mergeResources(&resources,(QPDFObjectHandle *)&local_90,dr_map);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  QPDFObjectHandle::ditems(&local_1d8.oh);
  QPDFObjectHandle::QPDFDictItems::begin((iterator *)&rf,&local_1d8);
  QPDFObjectHandle::QPDFDictItems::end((iterator *)&existing_new,&local_1d8);
  while( true ) {
    bVar3 = QPDFObjectHandle::QPDFDictItems::iterator::operator!=
                      ((iterator *)&rf,(iterator *)&existing_new);
    if (!bVar3) break;
    pTVar6 = QPDFObjectHandle::QPDFDictItems::iterator::operator*[abi_cxx11_((iterator *)&rf);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
            *)&existing_old,pTVar6);
    bVar3 = QPDFObjectHandle::isDictionary(&local_188);
    if (bVar3) {
      QPDFObjectHandle::getKeys_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_60,&local_188);
      sVar2 = local_60._M_impl.super__Rb_tree_header._M_node_count;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_60);
      if (sVar2 == 0) {
        QPDFObjectHandle::removeKey(&resources,(string *)&existing_old);
      }
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
             *)&existing_old);
    QPDFObjectHandle::QPDFDictItems::iterator::operator++((iterator *)&rf);
  }
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)&existing_new);
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)&rf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1d8.oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ResourceFinder::ResourceFinder(&rf);
  QPDF::numWarnings((this->super_QPDFDocumentHelper).qpdf);
  QPDFObjectHandle::parseAsContents(stream,&rf.super_ParserCallbacks);
  QPDF::numWarnings((this->super_QPDFDocumentHelper).qpdf);
  this_00 = (element_type *)operator_new(0x48);
  rnames = ResourceFinder::getNamesByResourceType_abi_cxx11_(&rf);
  anon_unknown.dwarf_1b0505::ResourceReplacer::ResourceReplacer
            ((ResourceReplacer *)this_00,dr_map,rnames);
  existing_new.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  existing_new.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  existing_new.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (existing_new.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (existing_new.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (existing_new.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_002ad100;
  existing_new.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)this_00;
  std::__shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,
             (__shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2> *)
             &existing_new);
  QPDFObjectHandle::addTokenFilter(stream,(shared_ptr<QPDFObjectHandle::TokenFilter> *)&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&existing_new.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ResourceFinder::~ResourceFinder(&rf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&merge_with.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&resources.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::adjustAppearanceStream(
    QPDFObjectHandle stream, std::map<std::string, std::map<std::string, std::string>> dr_map)
{
    // We don't have to modify appearance streams or their resource dictionaries for them to display
    // properly, but we need to do so to make them save to regenerate. Suppose an appearance stream
    // as a font /F1 that is different from /F1 in /DR, and that when we copy the field, /F1 is
    // remapped to /F1_1. When the field is regenerated, /F1_1 won't appear in the stream's resource
    // dictionary, so the regenerated appearance stream will revert to the /F1_1 in /DR. If we
    // adjust existing appearance streams, we are protected from this problem.

    auto dict = stream.getDict();
    auto resources = dict.getKey("/Resources");

    // Make sure this stream has its own private resource dictionary.
    bool was_indirect = resources.isIndirect();
    resources = resources.shallowCopy();
    if (was_indirect) {
        resources = qpdf.makeIndirectObject(resources);
    }
    dict.replaceKey("/Resources", resources);
    // Create a dictionary with top-level keys so we can use mergeResources to force them to be
    // unshared. We will also use this to resolve conflicts that may already be in the resource
    // dictionary.
    auto merge_with = QPDFObjectHandle::newDictionary();
    for (auto const& top_key: dr_map) {
        merge_with.replaceKey(top_key.first, QPDFObjectHandle::newDictionary());
    }
    resources.mergeResources(merge_with);
    // Rename any keys in the resource dictionary that we remapped.
    for (auto const& i1: dr_map) {
        std::string const& top_key = i1.first;
        auto subdict = resources.getKey(top_key);
        if (!subdict.isDictionary()) {
            continue;
        }
        for (auto const& i2: i1.second) {
            std::string const& old_key = i2.first;
            std::string const& new_key = i2.second;
            auto existing_new = subdict.getKey(new_key);
            if (!existing_new.isNull()) {
                // The resource dictionary already has a key in it matching what we remapped an old
                // key to, so we'll have to move it out of the way. Stick it in merge_with, which we
                // will re-merge with the dictionary when we're done. We know merge_with already has
                // dictionaries for all the top keys.
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper ap conflict");
                merge_with.getKey(top_key).replaceKey(new_key, existing_new);
            }
            auto existing_old = subdict.getKey(old_key);
            if (!existing_old.isNull()) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper ap rename");
                subdict.replaceKey(new_key, existing_old);
                subdict.removeKey(old_key);
            }
        }
    }
    // Deal with any any conflicts by re-merging with merge_with and updating our local copy of
    // dr_map, which we will use to modify the stream contents.
    resources.mergeResources(merge_with, &dr_map);
    // Remove empty subdictionaries
    for (auto iter: resources.ditems()) {
        if (iter.second.isDictionary() && (iter.second.getKeys().size() == 0)) {
            resources.removeKey(iter.first);
        }
    }

    // Now attach a token filter to replace the actual resources.
    ResourceFinder rf;
    try {
        auto nwarnings = qpdf.numWarnings();
        stream.parseAsContents(&rf);
        if (qpdf.numWarnings() > nwarnings) {
            QTC::TC("qpdf", "QPDFAcroFormDocumentHelper AP parse error");
        }
        auto rr = new ResourceReplacer(dr_map, rf.getNamesByResourceType());
        auto tf = std::shared_ptr<QPDFObjectHandle::TokenFilter>(rr);
        stream.addTokenFilter(tf);
    } catch (std::exception& e) {
        // No way to reproduce in test suite right now since error conditions are converted to
        // warnings.
        stream.warnIfPossible(std::string("Unable to parse appearance stream: ") + e.what());
    }
}